

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_appender.cpp
# Opt level: O0

void __thiscall cornelich::excerpt_appender::finish(excerpt_appender *this)

{
  int iVar1;
  bool bVar2;
  int32_t iVar3;
  logic_error *this_00;
  uint *puVar4;
  element_type *peVar5;
  uint8_t *puVar6;
  element_type *peVar7;
  uint8_t *puVar8;
  char *pcVar9;
  int64_t iVar10;
  pair<std::shared_ptr<cornelich::region>,_long> *__in;
  int32_t *piVar11;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  char *in_RSI;
  long local_d8;
  shared_ptr<cornelich::region> local_80;
  pair<std::shared_ptr<cornelich::region>,_long> local_70;
  long local_58;
  int64_t position;
  long index_value;
  long data_offset;
  int32_t length;
  excerpt_appender *local_30;
  excerpt_appender *this_local;
  uint *local_20;
  int32_t *ptr;
  element_type *local_10;
  
  local_30 = this;
  if ((this->m_finished & 1U) == 0) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_data_region);
    if (bVar2) {
      puVar4 = (uint *)util::buffer_view::position(&this->m_buffer);
      data_offset._0_4_ = ~*puVar4;
      peVar5 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_data_region);
      puVar6 = util::buffer_view::data(&this->m_buffer);
      peVar7 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_data_region);
      puVar8 = region::data(peVar7);
      ptr._4_4_ = ((int)puVar6 - (int)puVar8) + -4;
      ptr._0_4_ = (uint)data_offset;
      local_10 = peVar5;
      puVar6 = region::data(peVar5);
      local_20 = (uint *)(puVar6 + ptr._4_4_);
      this_local._4_4_ = (uint)ptr;
      *local_20 = (uint)ptr;
      peVar5 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_data_region);
      pcVar9 = region::index(peVar5,in_RSI,__c);
      iVar10 = vanilla_chronicle_settings::data_block_size(&this->m_chronicle->m_settings);
      puVar6 = util::buffer_view::data(&this->m_buffer);
      peVar5 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_data_region);
      __in = (pair<std::shared_ptr<cornelich::region>,_long> *)region::data(peVar5);
      index_value = (long)(puVar6 + ((int)pcVar9 * iVar10 - (long)__in));
      iVar1 = this->m_last_thread_id;
      iVar3 = vanilla_chronicle_settings::index_data_offset_bits(&this->m_chronicle->m_settings);
      position = ((long)iVar1 << ((byte)iVar3 & 0x3f)) + index_value;
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_index_region);
      if (bVar2) {
        peVar5 = std::
                 __shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_index_region);
        __in = (pair<std::shared_ptr<cornelich::region>,_long> *)position;
        local_d8 = vanilla_index::append(peVar5,position);
      }
      else {
        local_d8 = -1;
      }
      local_58 = local_d8;
      if (local_d8 < 0) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_index_region);
        if (bVar2) {
          peVar5 = std::
                   __shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->m_index_region);
          pcVar9 = region::index(peVar5,(char *)__in,__c_00);
          this->m_last_index_file_number = (int)pcVar9 + 1;
          std::__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>::reset
                    (&(this->m_index_region).
                      super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>);
        }
        vanilla_index::append
                  (&local_70,&this->m_chronicle->m_index,this->m_last_cycle,position,
                   this->m_last_index_file_number);
        std::tie<std::shared_ptr<cornelich::region>,long>(&local_80,(long *)&this->m_index_region);
        __in = &local_70;
        std::tuple<std::shared_ptr<cornelich::region>&,long&>::operator=
                  ((tuple<std::shared_ptr<cornelich::region>&,long&> *)&local_80,__in);
        std::pair<std::shared_ptr<cornelich::region>,_long>::~pair(&local_70);
        peVar5 = std::
                 __shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_index_region);
        pcVar9 = region::index(peVar5,(char *)__in,__c_01);
        this->m_last_index_file_number = (int32_t)pcVar9;
      }
      iVar1 = this->m_last_cycle;
      peVar5 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_index_region);
      pcVar9 = region::index(peVar5,(char *)__in,__c_02);
      set_last_written_index(this,(long)iVar1,(long)(int)pcVar9,local_58);
      this->m_index = this->m_last_written_index + 1;
      peVar5 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_data_region);
      peVar7 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_data_region);
      iVar3 = region::position(peVar7);
      piVar11 = util::buffer_view::position(&this->m_buffer);
      region::position(peVar5,iVar3 + *piVar11 + 4);
      peVar5 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_data_region);
      region::align_position(peVar5,4);
      this->m_finished = true;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Not started");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void excerpt_appender::finish()
{
    if(m_finished)
        throw std::logic_error("Not started");

    if(!m_data_region)
        return;

    const auto length = ~static_cast<std::int32_t>(m_buffer.position());

    m_data_region->write_ordered32(static_cast<std::int32_t>(m_buffer.data() - m_data_region->data() - 4), length);

    const auto data_offset = m_data_region->index() * m_chronicle.m_settings.data_block_size() + (m_buffer.data() - m_data_region->data());
    const auto index_value = (static_cast<std::int64_t>(m_last_thread_id) << m_chronicle.m_settings.index_data_offset_bits()) + data_offset;

    auto position = m_index_region ? vanilla_index::append(*m_index_region, index_value) : -1;
    if (position < 0)
    {
        if (m_index_region)
        {
            m_last_index_file_number = static_cast<std::int32_t>(m_index_region->index()) + 1;
            m_index_region.reset();
        }

        std::tie(m_index_region, position) = m_chronicle.m_index.append(m_last_cycle, index_value, m_last_index_file_number);
        m_last_index_file_number = m_index_region->index();
    }

    set_last_written_index(m_last_cycle, m_index_region->index(), position);

    m_index = m_last_written_index + 1;
    m_data_region->position(m_data_region->position() + m_buffer.position() + 4);
    m_data_region->align_position(4);
    m_finished = true;
}